

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecWrd.h
# Opt level: O0

void Vec_WrdGrow(Vec_Wrd_t *p,int nCapMin)

{
  word *local_20;
  int nCapMin_local;
  Vec_Wrd_t *p_local;
  
  if (p->nCap < nCapMin) {
    if (p->pArray == (word *)0x0) {
      local_20 = (word *)malloc((long)nCapMin << 3);
    }
    else {
      local_20 = (word *)realloc(p->pArray,(long)nCapMin << 3);
    }
    p->pArray = local_20;
    if (p->pArray == (word *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                    ,0x205,"void Vec_WrdGrow(Vec_Wrd_t *, int)");
    }
    p->nCap = nCapMin;
  }
  return;
}

Assistant:

static inline void Vec_WrdGrow( Vec_Wrd_t * p, int nCapMin )
{
    if ( p->nCap >= nCapMin )
        return;
    p->pArray = ABC_REALLOC( word, p->pArray, nCapMin ); 
    assert( p->pArray );
    p->nCap   = nCapMin;
}